

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O1

int diffs(double *sig,int N,int D,int s,double *oup)

{
  double dVar1;
  double *C;
  long lVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  double *pdVar6;
  long lVar7;
  int iVar8;
  double dVar9;
  
  iVar8 = s * D;
  lVar4 = (long)iVar8;
  C = (double *)malloc(lVar4 * 8 + 8);
  delds(D,s,C);
  if (N - iVar8 != 0 && iVar8 <= N) {
    dVar1 = *C;
    lVar2 = (long)s;
    pdVar3 = sig + (lVar4 - lVar2);
    lVar5 = lVar4;
    do {
      dVar9 = 0.0;
      pdVar6 = pdVar3;
      lVar7 = lVar2;
      if (s <= iVar8) {
        do {
          dVar9 = dVar9 + *pdVar6 * C[lVar7];
          lVar7 = lVar7 + lVar2;
          pdVar6 = pdVar6 + -lVar2;
        } while (lVar7 <= lVar4);
      }
      oup[lVar5 - lVar4] = sig[lVar5] * dVar1 + dVar9;
      lVar5 = lVar5 + 1;
      pdVar3 = pdVar3 + 1;
    } while (lVar5 != N);
  }
  free(C);
  return N - iVar8;
}

Assistant:

int diffs(double *sig, int N, int D,int s, double *oup) {
	int Noup,i,j,d;
	double *coeff;
	double sum;
	/*
	 * diffs output = [ X(t) - X(t-s) ] ^ D where X(t) is the
	 * input timeseries of length N
	 * output is of length N - D*s
	 * 
	 * 
	 * s - seasonal component, D = 1 when seasonal component is present and 0
	 * when it is absent. D >= 2 is rarely needed and in most cases you may want
	 *  to re-analyze data if D >= 2 is needed.
	 * s = 4 (quarterly data), 12 (yearly data) etc.
	 * 
	 * D - Differencing operator. D >= 1 when seasonal component is present
	 * D is usually 1 when you are differencing [ X(t) - X(t-s) ]
	 * D = 2 yields [ X(t) - X(t-s) ] * [ X(t) - X(t-s) ]
	 * see Chapter 9 of Box Jenkins for detrending and deseasoning seasonal data
	 * with trends 
	 */ 
	
	d = D*s;
	coeff = (double*) malloc(sizeof(double) * (d+1));
	delds(D,s,coeff);
	Noup = N - d;
	
	for(i = d; i < N;++i) {
		sum = 0.;
		for(j = s; j < d+1;j+=s) {
			sum += sig[i-j]*coeff[j];
		}
		oup[i-d] = sum + coeff[0] * sig[i];
		
	}
	
	free(coeff);
	
	return Noup;
}